

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O3

void RunDeadCodeElimiation(ExpressionContext *ctx,VmModule *module,VmFunction *function)

{
  VmInstructionType VVar1;
  VmValue *pVVar2;
  VmBlock **ppVVar3;
  VmValue **ppVVar4;
  uint uVar5;
  VmBlock *pVVar6;
  VmBlock *curr;
  VmBlock *pVVar7;
  VmBlock *pVVar8;
  ulong uVar9;
  VmInstruction *inst;
  ulong uVar10;
  
  pVVar6 = function->firstBlock;
  pVVar7 = pVVar6;
  if (pVVar6 != (VmBlock *)0x0) {
    do {
      (pVVar7->predecessors).count = 0;
      (pVVar7->successors).count = 0;
      ppVVar3 = &pVVar7->nextSibling;
      pVVar7 = *ppVVar3;
    } while (*ppVVar3 != (VmBlock *)0x0);
    do {
      uVar5 = (pVVar6->super_VmValue).users.count;
      if (uVar5 != 0) {
        uVar9 = 0;
        do {
          pVVar2 = (pVVar6->super_VmValue).users.data[uVar9];
          if (((pVVar2 != (VmValue *)0x0) && (pVVar2->typeID == 2)) &&
             (*(int *)&pVVar2[1]._vptr_VmValue != 0x4d)) {
            uVar5 = (pVVar6->predecessors).count;
            if (uVar5 == (pVVar6->predecessors).max) {
              SmallArray<VmBlock_*,_4U>::grow(&pVVar6->predecessors,uVar5);
            }
            ppVVar3 = (pVVar6->predecessors).data;
            if (ppVVar3 == (VmBlock **)0x0) {
LAB_001b014d:
              __assert_fail("data",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                            ,0x162,
                            "void SmallArray<VmBlock *, 4>::push_back(const T &) [T = VmBlock *, N = 4]"
                           );
            }
            pVVar7 = (VmBlock *)pVVar2[1].users.data;
            uVar5 = (pVVar6->predecessors).count;
            (pVVar6->predecessors).count = uVar5 + 1;
            ppVVar3[uVar5] = pVVar7;
            uVar5 = (pVVar7->successors).count;
            if (uVar5 == (pVVar7->successors).max) {
              SmallArray<VmBlock_*,_4U>::grow(&pVVar7->successors,uVar5);
            }
            ppVVar3 = (pVVar7->successors).data;
            if (ppVVar3 == (VmBlock **)0x0) goto LAB_001b014d;
            uVar5 = (pVVar7->successors).count;
            (pVVar7->successors).count = uVar5 + 1;
            ppVVar3[uVar5] = pVVar6;
            uVar5 = (pVVar6->super_VmValue).users.count;
          }
          uVar9 = uVar9 + 1;
        } while (uVar9 < uVar5);
      }
      pVVar6 = pVVar6->nextSibling;
    } while (pVVar6 != (VmBlock *)0x0);
    pVVar6 = function->firstBlock;
    for (pVVar7 = pVVar6; pVVar7 != (VmBlock *)0x0; pVVar7 = pVVar7->nextSibling) {
      pVVar7->visited = false;
    }
    MarkReachableBlocks(pVVar6);
    pVVar6 = function->firstBlock->nextSibling;
    pVVar7 = function->firstBlock;
    if (pVVar6 != (VmBlock *)0x0) {
      do {
        pVVar7 = pVVar6->nextSibling;
        if (pVVar6->visited == false) {
LAB_001aff67:
          uVar5 = (pVVar6->super_VmValue).users.count;
          if (uVar5 != 0) {
            inst = (VmInstruction *)(pVVar6->super_VmValue).users.data[uVar5 - 1];
            if ((inst == (VmInstruction *)0x0) || ((inst->super_VmValue).typeID != 2)) {
              inst = (VmInstruction *)0x0;
            }
            VVar1 = inst->cmd;
            if (VVar1 - VM_INST_JUMP_Z < 2) {
              uVar5 = (inst->arguments).count;
              if (uVar5 < 2) {
LAB_001b012e:
                __assert_fail("index < count",
                              "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                              ,0x199,
                              "T &SmallArray<VmValue *, 4>::operator[](unsigned int) [T = VmValue *, N = 4]"
                             );
              }
              ppVVar4 = (inst->arguments).data;
              pVVar8 = (VmBlock *)ppVVar4[1];
              if (pVVar8 == pVVar6) {
                if (uVar5 == 2) goto LAB_001b012e;
                pVVar8 = (VmBlock *)ppVVar4[2];
              }
              anon_unknown.dwarf_12e14a::ChangeInstructionTo
                        ((VmModule *)module->allocator,inst,VM_INST_JUMP,&pVVar8->super_VmValue,
                         (VmValue *)0x0,(VmValue *)0x0,(VmValue *)0x0,(VmValue *)0x0,(uint *)0x0);
            }
            else if (VVar1 == VM_INST_JUMP) {
              VmBlock::RemoveInstruction(inst->parent,inst);
            }
            else if ((VVar1 == VM_INST_PHI) && (uVar9 = (ulong)(inst->arguments).count, uVar9 != 0))
            {
              ppVVar4 = (inst->arguments).data;
              uVar10 = 0;
              do {
                if (uVar9 <= uVar10 + 1) goto LAB_001b012e;
                pVVar8 = (VmBlock *)ppVVar4[uVar10 + 1];
                if (pVVar8 == pVVar6) {
                  VmValue::RemoveUse(ppVVar4[uVar10],&inst->super_VmValue);
                  VmValue::RemoveUse((VmValue *)pVVar8,&inst->super_VmValue);
                  uVar5 = (inst->arguments).count;
                  if ((uVar5 < 2) || (uVar5 <= (uint)uVar10)) goto LAB_001b012e;
                  ppVVar4 = (inst->arguments).data;
                  ppVVar4[uVar10] = ppVVar4[uVar5 - 2];
                  if (uVar5 <= (uint)(uVar10 + 1)) goto LAB_001b012e;
                  ppVVar4 = (inst->arguments).data;
                  ppVVar4[uVar10 + 1] = ppVVar4[uVar5 - 1];
                  (inst->arguments).count = uVar5 - 2;
                  break;
                }
                uVar10 = uVar10 + 2;
              } while (uVar10 < uVar9);
            }
            goto LAB_001aff67;
          }
        }
        pVVar6 = pVVar7;
      } while (pVVar7 != (VmBlock *)0x0);
      pVVar7 = function->firstBlock;
      if (function->firstBlock == (VmBlock *)0x0) {
        return;
      }
    }
    do {
      pVVar6 = pVVar7->nextSibling;
      RunDeadCodeElimiation(ctx,module,pVVar7);
      pVVar7 = pVVar6;
    } while (pVVar6 != (VmBlock *)0x0);
    for (pVVar6 = function->firstBlock; pVVar6 != (VmBlock *)0x0; pVVar6 = pVVar6->nextSibling) {
      if (pVVar6->visited == false) {
        __assert_fail("curr->visited",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                      ,0x1352,
                      "void RunDeadCodeElimiation(ExpressionContext &, VmModule *, VmFunction *)");
      }
      pVVar6->visited = false;
    }
  }
  return;
}

Assistant:

void RunDeadCodeElimiation(ExpressionContext &ctx, VmModule *module, VmFunction* function)
{
	if(!function->firstBlock)
		return;

	for(VmBlock *curr = function->firstBlock; curr; curr = curr->nextSibling)
	{
		curr->predecessors.clear();
		curr->successors.clear();
	}

	// Get block predecessors and successors
	for(VmBlock *curr = function->firstBlock; curr; curr = curr->nextSibling)
	{
		for(unsigned i = 0; i < curr->users.size(); i++)
		{
			VmValue *user = curr->users[i];

			if(VmInstruction *inst = getType<VmInstruction>(user))
			{
				if(inst->cmd != VM_INST_PHI)
				{
					curr->predecessors.push_back(inst->parent);
					inst->parent->successors.push_back(curr);
				}
			}
		}
	}

	for(VmBlock *curr = function->firstBlock; curr; curr = curr->nextSibling)
		curr->visited = false;

	MarkReachableBlocks(function->firstBlock);

	// Remove blocks that are unreachable from entry
	for(VmBlock *curr = function->firstBlock->nextSibling; curr;)
	{
		VmBlock *next = curr->nextSibling;

		if(!curr->visited)
		{
			while(!curr->users.empty())
			{
				VmInstruction *inst = getType<VmInstruction>(curr->users.back());

				if(inst->cmd == VM_INST_JUMP)
				{
					inst->parent->RemoveInstruction(inst);
				}
				else if(inst->cmd == VM_INST_JUMP_NZ || inst->cmd == VM_INST_JUMP_Z)
				{
					if(inst->arguments[1] == curr)
						ChangeInstructionTo(module, inst, VM_INST_JUMP, inst->arguments[2], NULL, NULL, NULL, NULL, NULL);
					else
						ChangeInstructionTo(module, inst, VM_INST_JUMP, inst->arguments[1], NULL, NULL, NULL, NULL, NULL);
				}
				else if(inst->cmd == VM_INST_PHI)
				{
					for(unsigned i = 0; i < inst->arguments.size(); i += 2)
					{
						VmValue *option = inst->arguments[i];
						VmValue *edge = inst->arguments[i + 1];

						if(edge == curr)
						{
							option->RemoveUse(inst);
							edge->RemoveUse(inst);

							inst->arguments[i] = inst->arguments[inst->arguments.size() - 2];
							inst->arguments[i + 1] = inst->arguments[inst->arguments.size() - 1];

							inst->arguments.pop_back();
							inst->arguments.pop_back();

							break;
						}
					}
				}
			}
		}

		curr = next;
	}

	VmBlock *curr = function->firstBlock;

	while(curr)
	{
		VmBlock *next = curr->nextSibling;
		RunDeadCodeElimiation(ctx, module, curr);
		curr = next;
	}

	for(VmBlock *curr = function->firstBlock; curr; curr = curr->nextSibling)
	{
		// Check that only reachable blocks remain
		assert(curr->visited);

		curr->visited = false;
	}
}